

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  ulong uVar25;
  byte bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi;
  undefined1 auVar53 [16];
  vint4 bi_1;
  undefined1 auVar54 [16];
  vint4 ai;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ulong local_808;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar18 = local_7d0;
  local_7d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar44._4_4_ = fVar1;
  auVar44._0_4_ = fVar1;
  auVar44._8_4_ = fVar1;
  auVar44._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar45._4_4_ = fVar2;
  auVar45._0_4_ = fVar2;
  auVar45._8_4_ = fVar2;
  auVar45._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar46._4_4_ = fVar3;
  auVar46._0_4_ = fVar3;
  auVar46._8_4_ = fVar3;
  auVar46._12_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar47._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar47._8_4_ = -fVar1;
  auVar47._12_4_ = -fVar1;
  auVar48._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar48._8_4_ = -fVar2;
  auVar48._12_4_ = -fVar2;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar49._4_4_ = iVar4;
  auVar49._0_4_ = iVar4;
  auVar49._8_4_ = iVar4;
  auVar49._12_4_ = iVar4;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar50._4_4_ = iVar4;
  auVar50._0_4_ = iVar4;
  auVar50._8_4_ = iVar4;
  auVar50._12_4_ = iVar4;
  auVar51._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar51._8_4_ = -fVar3;
  auVar51._12_4_ = -fVar3;
  bVar23 = true;
  do {
    uVar20 = puVar18[-1];
    puVar18 = puVar18 + -1;
    while ((uVar20 & 8) == 0) {
      auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar20 + 0x20 + uVar16),auVar47,auVar44);
      auVar52 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar20 + 0x20 + uVar17),auVar48,auVar45);
      auVar27 = vpmaxsd_avx(auVar27,auVar52);
      auVar52 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar20 + 0x20 + uVar19),auVar51,auVar46);
      auVar52 = vpmaxsd_avx(auVar52,auVar49);
      auVar27 = vpmaxsd_avx(auVar27,auVar52);
      auVar52 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar20 + 0x20 + (uVar16 ^ 0x10)),auVar47,
                                auVar44);
      auVar53 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar20 + 0x20 + (uVar17 ^ 0x10)),auVar48,
                                auVar45);
      auVar52 = vpminsd_avx(auVar52,auVar53);
      auVar53 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar20 + 0x20 + (uVar19 ^ 0x10)),auVar51,
                                auVar46);
      auVar53 = vpminsd_avx(auVar53,auVar50);
      auVar52 = vpminsd_avx(auVar52,auVar53);
      uVar25 = vpcmpd_avx512vl(auVar27,auVar52,2);
      uVar25 = uVar25 & 0xf;
      if ((char)uVar25 == '\0') goto LAB_006bbcb9;
      uVar13 = uVar20 & 0xfffffffffffffff0;
      lVar15 = 0;
      for (uVar20 = uVar25; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        lVar15 = lVar15 + 1;
      }
      uVar20 = *(ulong *)(uVar13 + lVar15 * 8);
      uVar21 = (uint)uVar25 - 1 & (uint)uVar25;
      uVar25 = (ulong)uVar21;
      if (uVar21 != 0) {
        *puVar18 = uVar20;
        lVar15 = 0;
        for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
          lVar15 = lVar15 + 1;
        }
        uVar21 = uVar21 - 1 & uVar21;
        uVar25 = (ulong)uVar21;
        bVar22 = uVar21 == 0;
        while( true ) {
          puVar18 = puVar18 + 1;
          uVar20 = *(ulong *)(uVar13 + lVar15 * 8);
          if (bVar22) break;
          *puVar18 = uVar20;
          lVar15 = 0;
          for (uVar20 = uVar25; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar15 = lVar15 + 1;
          }
          uVar25 = uVar25 - 1 & uVar25;
          bVar22 = uVar25 == 0;
        }
      }
    }
    uVar25 = (ulong)((uint)uVar20 & 0xf);
    if (uVar25 != 8) {
      uVar5 = *(undefined4 *)(ray + k * 4);
      auVar52._4_4_ = uVar5;
      auVar52._0_4_ = uVar5;
      auVar52._8_4_ = uVar5;
      auVar52._12_4_ = uVar5;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar53._4_4_ = uVar5;
      auVar53._0_4_ = uVar5;
      auVar53._8_4_ = uVar5;
      auVar53._12_4_ = uVar5;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar54._4_4_ = uVar5;
      auVar54._0_4_ = uVar5;
      auVar54._8_4_ = uVar5;
      auVar54._12_4_ = uVar5;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar55._4_4_ = uVar5;
      auVar55._0_4_ = uVar5;
      auVar55._8_4_ = uVar5;
      auVar55._12_4_ = uVar5;
      uVar20 = uVar20 & 0xfffffffffffffff0;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar56._4_4_ = uVar5;
      auVar56._0_4_ = uVar5;
      auVar56._8_4_ = uVar5;
      auVar56._12_4_ = uVar5;
      auVar27 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      lVar15 = 0;
      do {
        lVar14 = lVar15 * 0xb0;
        auVar41 = *(undefined1 (*) [16])(uVar20 + 0x80 + lVar14);
        auVar43 = *(undefined1 (*) [16])(uVar20 + 0x40 + lVar14);
        auVar42 = *(undefined1 (*) [16])(uVar20 + 0x70 + lVar14);
        auVar6 = *(undefined1 (*) [16])(uVar20 + 0x50 + lVar14);
        auVar28 = vmulps_avx512vl(auVar43,auVar41);
        auVar29 = vfmsub231ps_avx512vl(auVar28,auVar42,auVar6);
        auVar28 = *(undefined1 (*) [16])(uVar20 + 0x60 + lVar14);
        auVar30 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar20 + lVar14),auVar52);
        auVar31 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar20 + 0x10 + lVar14),auVar53);
        auVar7 = *(undefined1 (*) [16])(uVar20 + 0x30 + lVar14);
        auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar20 + 0x20 + lVar14),auVar54);
        auVar33 = vmulps_avx512vl(auVar6,auVar28);
        auVar34 = vfmsub231ps_avx512vl(auVar33,auVar41,auVar7);
        auVar33 = vmulps_avx512vl(auVar7,auVar42);
        auVar35 = vfmsub231ps_avx512vl(auVar33,auVar28,auVar43);
        auVar33 = vmulps_avx512vl(auVar56,auVar32);
        auVar36 = vfmsub231ps_avx512vl(auVar33,auVar31,auVar27);
        auVar33 = vmulps_avx512vl(auVar27,auVar30);
        auVar37 = vfmsub231ps_avx512vl(auVar33,auVar32,auVar55);
        auVar33 = vmulps_avx512vl(auVar55,auVar31);
        auVar38 = vfmsub231ps_avx512vl(auVar33,auVar30,auVar56);
        auVar33 = vmulps_avx512vl(auVar35,auVar27);
        auVar33 = vfmadd231ps_avx512vl(auVar33,auVar34,auVar56);
        auVar39 = vfmadd231ps_avx512vl(auVar33,auVar29,auVar55);
        auVar33._8_4_ = 0x7fffffff;
        auVar33._0_8_ = 0x7fffffff7fffffff;
        auVar33._12_4_ = 0x7fffffff;
        auVar33 = vandps_avx512vl(auVar39,auVar33);
        auVar40._8_4_ = 0x80000000;
        auVar40._0_8_ = 0x8000000080000000;
        auVar40._12_4_ = 0x80000000;
        auVar40 = vandps_avx512vl(auVar39,auVar40);
        auVar41 = vmulps_avx512vl(auVar41,auVar38);
        auVar41 = vfmadd231ps_avx512vl(auVar41,auVar37,auVar42);
        auVar41 = vfmadd231ps_avx512vl(auVar41,auVar36,auVar28);
        auVar41 = vxorps_avx512vl(auVar40,auVar41);
        auVar42 = vmulps_avx512vl(auVar6,auVar38);
        auVar43 = vfmadd231ps_avx512vl(auVar42,auVar43,auVar37);
        auVar43 = vfmadd231ps_avx512vl(auVar43,auVar7,auVar36);
        auVar43 = vxorps_avx512vl(auVar40,auVar43);
        auVar42 = ZEXT816(0) << 0x20;
        uVar8 = vcmpps_avx512vl(auVar41,auVar42,5);
        uVar9 = vcmpps_avx512vl(auVar43,auVar42,5);
        uVar10 = vcmpps_avx512vl(auVar39,auVar42,4);
        auVar41 = vaddps_avx512vl(auVar41,auVar43);
        uVar11 = vcmpps_avx512vl(auVar41,auVar33,2);
        bVar24 = (byte)uVar8 & (byte)uVar9 & (byte)uVar10 & (byte)uVar11;
        if (bVar24 != 0) {
          auVar41 = vmulps_avx512vl(auVar35,auVar32);
          auVar41 = vfmadd213ps_avx512vl(auVar31,auVar34,auVar41);
          auVar43 = vfmadd213ps_avx512vl(auVar30,auVar29,auVar41);
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar41._4_4_ = uVar5;
          auVar41._0_4_ = uVar5;
          auVar41._8_4_ = uVar5;
          auVar41._12_4_ = uVar5;
          auVar41 = vmulps_avx512vl(auVar33,auVar41);
          auVar42 = vxorps_avx512vl(auVar40,auVar43);
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar43._4_4_ = uVar5;
          auVar43._0_4_ = uVar5;
          auVar43._8_4_ = uVar5;
          auVar43._12_4_ = uVar5;
          auVar43 = vmulps_avx512vl(auVar33,auVar43);
          uVar8 = vcmpps_avx512vl(auVar42,auVar43,2);
          uVar9 = vcmpps_avx512vl(auVar41,auVar42,1);
          bVar26 = (byte)uVar8 & (byte)uVar9;
          if ((bVar26 & bVar24) != 0) {
            local_808 = (ulong)(bVar26 & bVar24);
            do {
              uVar13 = 0;
              for (uVar12 = local_808; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000)
              {
                uVar13 = uVar13 + 1;
              }
              if ((((context->scene->geometries).items
                    [*(uint *)(lVar14 + uVar20 + 0x90 + uVar13 * 4)].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x90)) != 0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar23;
              }
              local_808 = local_808 ^ 1L << (uVar13 & 0x3f);
            } while (local_808 != 0);
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != uVar25 - 8);
    }
LAB_006bbcb9:
    bVar23 = puVar18 != &local_7d8;
    if (!bVar23) {
      return bVar23;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }